

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O3

void __thiscall
CDoodadsMapper::Proceed(CDoodadsMapper *this,CLayerTiles *pLayer,int ConfigID,int Amount)

{
  CRuleSet *pCVar1;
  CTile *pCVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  CDoodadsMapper *this_00;
  ulong uVar6;
  CRule *pCVar7;
  long lVar8;
  bool bVar9;
  
  if (((-1 < ConfigID) && ((pLayer->super_CLayer).m_Readonly == false)) &&
     (ConfigID < (this->m_aRuleSets).num_elements)) {
    AnalyzeGameLayer(this);
    pCVar1 = (this->m_aRuleSets).list;
    iVar3 = pCVar1[(uint)ConfigID].m_aRules.num_elements;
    if (iVar3 != 0) {
      uVar5 = pLayer->m_Height * pLayer->m_Width;
      if (0 < (int)uVar5) {
        pCVar2 = pLayer->m_pTiles;
        uVar6 = 0;
        do {
          pCVar2[uVar6].m_Index = '\0';
          pCVar2[uVar6].m_Flags = '\0';
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      this_00 = (CDoodadsMapper *)(ulong)uVar5;
      if (0 < iVar3) {
        lVar8 = 0;
        lVar4 = 0;
        do {
          pCVar7 = pCVar1[(uint)ConfigID].m_aRules.list;
          iVar3 = *(int *)((long)&pCVar7->m_Location + lVar8);
          pCVar7 = (CRule *)((long)&(pCVar7->m_Rect).field_0 + lVar8);
          if (iVar3 == 0) {
            if (0 < (this->m_FloorIDs).num_elements) {
              PlaceDoodads(this_00,pLayer,pCVar7,&this->m_FloorIDs,Amount,0);
              iVar3 = pCVar7->m_Location;
              goto LAB_001902f1;
            }
          }
          else {
LAB_001902f1:
            if ((iVar3 == 1) && (0 < (this->m_CeilingIDs).num_elements)) {
              PlaceDoodads(this_00,pLayer,pCVar7,&this->m_CeilingIDs,Amount,0);
              iVar3 = pCVar7->m_Location;
            }
            if (iVar3 == 2) {
              if ((this->m_RightWallIDs).num_elements < 1) {
                bVar9 = true;
              }
              else {
                PlaceDoodads(this_00,pLayer,pCVar7,&this->m_RightWallIDs,Amount,0);
                bVar9 = pCVar7->m_Location == 2;
              }
              if ((bVar9) && (0 < (this->m_LeftWallIDs).num_elements)) {
                PlaceDoodads(this_00,pLayer,pCVar7,&this->m_LeftWallIDs,Amount,1);
              }
            }
          }
          lVar4 = lVar4 + 1;
          lVar8 = lVar8 + 0x28;
        } while (lVar4 < pCVar1[(uint)ConfigID].m_aRules.num_elements);
      }
      (((this->super_IAutoMapper).m_pEditor)->m_Map).m_Modified = true;
    }
  }
  return;
}

Assistant:

void CDoodadsMapper::Proceed(CLayerTiles *pLayer, int ConfigID, int Amount)
{
	if(pLayer->m_Readonly || ConfigID < 0 || ConfigID >= m_aRuleSets.size())
		return;

	AnalyzeGameLayer();

	CRuleSet *pConf = &m_aRuleSets[ConfigID];

	if(!pConf->m_aRules.size())
		return;

	int MaxIndex = pLayer->m_Width*pLayer->m_Height;

	// clear tiles
	for(int i = 0 ; i < MaxIndex; i++)
	{
		pLayer->m_pTiles[i].m_Index = 0;
		pLayer->m_pTiles[i].m_Flags = 0;
	}

	// place doodads
	for(int i = 0 ; i < pConf->m_aRules.size(); i++)
	{
		CRule *pRule = &pConf->m_aRules[i];

		// floors
		if(pRule->m_Location == CRule::FLOOR && m_FloorIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_FloorIDs, Amount);
		}

		// ceilings
		if(pRule->m_Location == CRule::CEILING && m_CeilingIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_CeilingIDs, Amount);
		}

		// right walls
		if(pRule->m_Location == CRule::WALLS && m_RightWallIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_RightWallIDs, Amount);
		}

		// left walls
		if(pRule->m_Location == CRule::WALLS && m_LeftWallIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_LeftWallIDs, Amount, 1);
		}
	}

	m_pEditor->m_Map.m_Modified = true;
}